

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int archive_read_set_callback_data2(archive *_a,void *client_data,uint iindex)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  int magic_test;
  archive_read *a;
  uint iindex_local;
  void *client_data_local;
  archive *_a_local;
  
  iVar2 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_set_callback_data2");
  if (iVar2 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    if ((int)_a[1].error_string.buffer_length == 0) {
      pvVar3 = calloc(1,0x18);
      *(void **)&_a[1].current_codepage = pvVar3;
      lVar1._0_4_ = _a[1].current_codepage;
      lVar1._4_4_ = _a[1].current_oemcp;
      if (lVar1 == 0) {
        archive_set_error(_a,0xc,"No memory.");
        return -0x1e;
      }
      *(undefined4 *)&_a[1].error_string.buffer_length = 1;
    }
    if ((int)_a[1].error_string.buffer_length - 1U < iindex) {
      archive_set_error(_a,0x16,"Invalid index specified.");
      _a_local._4_4_ = -0x1e;
    }
    else {
      *(void **)(*(long *)&_a[1].current_codepage + (ulong)iindex * 0x18 + 0x10) = client_data;
      *(undefined8 *)(*(long *)&_a[1].current_codepage + (ulong)iindex * 0x18) = 0xffffffffffffffff;
      *(undefined8 *)(*(long *)&_a[1].current_codepage + (ulong)iindex * 0x18 + 8) =
           0xffffffffffffffff;
      _a_local._4_4_ = 0;
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_set_callback_data2(struct archive *_a, void *client_data,
    unsigned int iindex)
{
	struct archive_read *a = (struct archive_read *)_a;
	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_set_callback_data2");

	if (a->client.nodes == 0)
	{
		a->client.dataset = (struct archive_read_data_node *)
		    calloc(1, sizeof(*a->client.dataset));
		if (a->client.dataset == NULL)
		{
			archive_set_error(&a->archive, ENOMEM,
				"No memory.");
			return ARCHIVE_FATAL;
		}
		a->client.nodes = 1;
	}

	if (iindex > a->client.nodes - 1)
	{
		archive_set_error(&a->archive, EINVAL,
			"Invalid index specified.");
		return ARCHIVE_FATAL;
	}
	a->client.dataset[iindex].data = client_data;
	a->client.dataset[iindex].begin_position = -1;
	a->client.dataset[iindex].total_size = -1;
	return ARCHIVE_OK;
}